

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O0

void EV_StopPlat(int tag,bool remove)

{
  DPlat *pDVar1;
  DPlat *next;
  TThinkerIterator<DPlat> iterator;
  DPlat *scan;
  bool remove_local;
  int tag_local;
  
  TThinkerIterator<DPlat>::TThinkerIterator((TThinkerIterator<DPlat> *)&next,0x80);
  pDVar1 = TThinkerIterator<DPlat>::Next((TThinkerIterator<DPlat> *)&next);
  while (iterator.super_FThinkerIterator._16_8_ = pDVar1,
        iterator.super_FThinkerIterator._16_8_ != 0) {
    pDVar1 = TThinkerIterator<DPlat>::Next((TThinkerIterator<DPlat> *)&next);
    if ((*(int *)(iterator.super_FThinkerIterator._16_8_ + 0x68) != 3) &&
       (*(int *)(iterator.super_FThinkerIterator._16_8_ + 0x74) == tag)) {
      if (remove) {
        (**(code **)(*(long *)iterator.super_FThinkerIterator._16_8_ + 0x20))();
      }
      else {
        DPlat::Stop((DPlat *)iterator.super_FThinkerIterator._16_8_);
      }
    }
  }
  return;
}

Assistant:

void EV_StopPlat (int tag, bool remove)
{
	DPlat *scan;
	TThinkerIterator<DPlat> iterator;

	scan = iterator.Next();
	while (scan != nullptr)
	{
		DPlat *next = iterator.Next();
		if (scan->m_Status != DPlat::in_stasis && scan->m_Tag == tag)
		{
			if (!remove) scan->Stop();
			else scan->Destroy();
		}
		scan = next;
	}
}